

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t
DwaCompressor_uncompress
          (DwaCompressor *me,uint8_t *inPtr,uint64_t iSize,void *uncompressed_data,
          uint64_t uncompressed_size)

{
  CompressorScheme CVar1;
  uint8_t *puVar2;
  exr_result_t eVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint64_t uVar7;
  CscChannelSet *pCVar8;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  DwaCompressor *in_RDI;
  size_t in_R8;
  int y_2;
  int dstScanlineSize;
  int row_1;
  int byte;
  int x;
  uint8_t *dst;
  int y_1;
  int row;
  LossyDctDecoder decoder_1;
  uint16_t *linearLut;
  int pixelSize;
  DctCoderChannelData *dcddata;
  exr_coding_channel_info_t *chan_1;
  ChannelData *cd_1;
  size_t c_2;
  int bChan;
  int gChan;
  int rChan;
  CscChannelSet *cset;
  LossyDctDecoder decoder;
  size_t csc;
  exr_coding_channel_info_t *chan;
  ChannelData *cd;
  size_t c_1;
  int y;
  size_t c;
  size_t dstLen;
  size_t uncompBytes;
  size_t destLen_1;
  size_t destLen;
  uint8_t *compressedRleBuf;
  uint8_t *compressedDcBuf;
  uint8_t *compressedAcBuf;
  uint8_t *compressedUnknownBuf;
  uint8_t *packedDcBufferEnd;
  uint8_t *packedAcBufferEnd;
  uint8_t *outBufferEnd;
  size_t outBufferSize;
  uint64_t ruleSize;
  uint64_t dataLeft;
  uint8_t *dataPtr;
  uint64_t compressedSize;
  uint64_t acCompression;
  uint64_t totalDcUncompressedCount;
  uint64_t totalAcUncompressedCount;
  uint64_t rleRawSize;
  uint64_t rleUncompressedSize;
  uint64_t rleCompressedSize;
  uint64_t dcCompressedSize;
  uint64_t acCompressedSize;
  uint64_t unknownCompressedSize;
  uint64_t unknownUncompressedSize;
  uint64_t version;
  uint64_t counters [11];
  exr_result_t rv;
  uint64_t headerSize;
  uint8_t *in_stack_fffffffffffffd08;
  uint8_t *in_stack_fffffffffffffd10;
  int32_t in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  int32_t in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  DctCoderChannelData *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 uVar9;
  DctCoderChannelData *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  exr_transcoding_pipeline_buffer_id_t in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  int iVar10;
  uint16_t *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  int local_29c;
  int in_stack_fffffffffffffd68;
  int local_294;
  uint64_t *in_stack_fffffffffffffd70;
  uint64_t *in_stack_fffffffffffffd78;
  uint8_t **in_stack_fffffffffffffd80;
  DwaCompressor *in_stack_fffffffffffffd88;
  uint8_t *in_stack_fffffffffffffd90;
  exr_decode_pipeline_t *in_stack_fffffffffffffd98;
  uint64_t in_stack_fffffffffffffdb0;
  size_t *in_stack_fffffffffffffdd0;
  exr_coding_channel_info_t *peVar11;
  DwaCompressor *in_stack_fffffffffffffdd8;
  ChannelData *pCVar12;
  ChannelData *pCVar13;
  ulong local_220;
  LossyDctDecoder local_200;
  ulong local_1b0;
  exr_coding_channel_info_t *local_1a8;
  ChannelData *local_1a0;
  ulong local_198;
  int local_18c;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  LossyDctDecoder *d;
  long local_120;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  DctCoderChannelData *local_58;
  int local_44;
  size_t local_40;
  ulong local_28;
  void *local_20;
  DwaCompressor *local_18;
  exr_result_t local_c;
  
  local_40 = 0x58;
  local_44 = 0;
  if (in_RDX < 0x58) {
    local_c = 0x17;
  }
  else {
    local_28 = in_RDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    memset(in_RCX,0,in_R8);
    memcpy(&local_a8,local_20,local_40);
    priv_to_native64(&local_a8,0xb);
    lVar6 = (long)local_20 + local_40;
    if ((((local_28 < local_40 + local_98 + local_90 + local_88 + local_80) || (local_28 < local_98)
         ) || (local_28 < local_90)) || ((local_28 < local_88 || (local_28 < local_80)))) {
      local_c = 0x17;
    }
    else if (((((long)local_a0 < 0) || ((long)local_98 < 0)) ||
             (((long)local_90 < 0 ||
              ((((long)local_88 < 0 || ((long)local_80 < 0)) || ((long)local_78 < 0)))))) ||
            ((((long)local_70 < 0 || (local_68 < 0)) || (local_60 < 0)))) {
      local_c = 0x17;
    }
    else {
      if (local_a8 < 2) {
        local_18->_channelRules = sLegacyChannelRules;
        local_18->_channelRuleCount = 0x19;
      }
      else {
        local_44 = DwaCompressor_readChannelRules
                             (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                              in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
        local_40 = local_120 + local_40;
      }
      if (local_44 == 0) {
        local_44 = DwaCompressor_initializeBuffers
                             (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        local_c = local_44;
        if (local_44 == 0) {
          d = (LossyDctDecoder *)0x0;
          if (local_18->_packedDcBuffer != (uint8_t *)0x0) {
            d = (LossyDctDecoder *)local_18->_packedDcBuffer;
          }
          local_150 = lVar6 + local_98;
          local_158 = local_150 + local_90;
          local_160 = local_158 + local_88;
          if (local_a8 < 3) {
            local_148 = lVar6;
            local_44 = DwaCompressor_setupChannelData(local_18);
            if (local_98 != 0) {
              if (local_18->_planarUncBufferSize[0] < local_a0) {
                return 0x17;
              }
              eVar3 = exr_uncompress_buffer
                                ((void *)CONCAT44(in_stack_fffffffffffffd4c,
                                                  in_stack_fffffffffffffd48),
                                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                 in_stack_fffffffffffffd38,
                                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                 (size_t *)in_stack_fffffffffffffd28);
              if (eVar3 != 0) {
                return 0x17;
              }
            }
            if (local_90 != 0) {
              if ((local_18->_packedAcBuffer == (uint8_t *)0x0) ||
                 (local_18->_packedAcBufferSize <= (ulong)(local_68 * 2) &&
                  local_68 * 2 - local_18->_packedAcBufferSize != 0)) {
                return 0x17;
              }
              if (local_58 == (DctCoderChannelData *)0x0) {
                in_stack_fffffffffffffd08 = (uint8_t *)local_18->_decode->scratch_alloc_size_1;
                local_44 = internal_huf_decompress
                                     (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                      (uint64_t)in_stack_fffffffffffffd88,
                                      (uint16_t *)in_stack_fffffffffffffd80,
                                      (uint64_t)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                      in_stack_fffffffffffffdb0);
                in_stack_fffffffffffffd38 = local_58;
                if (local_44 != 0) {
                  return local_44;
                }
              }
              else {
                if (local_58 != (DctCoderChannelData *)0x1) {
                  return 0x17;
                }
                eVar3 = exr_uncompress_buffer
                                  ((void *)CONCAT44(in_stack_fffffffffffffd4c,
                                                    in_stack_fffffffffffffd48),
                                   CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                   (void *)0x1,
                                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                   (size_t *)in_stack_fffffffffffffd28);
                if (eVar3 != 0) {
                  return eVar3;
                }
                local_44 = 0;
                in_stack_fffffffffffffd38 = local_58;
                if (local_68 * 2 - local_168 != 0) {
                  return 0x17;
                }
              }
            }
            if (local_88 == 0) {
              if (local_60 != 0) {
                return 0x17;
              }
            }
            else {
              local_178 = local_60 << 1;
              if (local_18->_packedDcBufferSize < local_178) {
                return 0x17;
              }
              local_44 = internal_decode_alloc_buffer
                                   ((exr_decode_pipeline_t *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    in_stack_fffffffffffffd44,(void **)in_stack_fffffffffffffd38,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    (size_t)in_stack_fffffffffffffd28);
              if (local_44 != 0) {
                return local_44;
              }
              local_44 = exr_uncompress_buffer
                                   ((void *)CONCAT44(in_stack_fffffffffffffd4c,
                                                     in_stack_fffffffffffffd48),
                                    CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                    in_stack_fffffffffffffd38,
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    (size_t *)in_stack_fffffffffffffd28);
              if ((local_44 != 0) || (local_178 != local_170)) {
                return 0x17;
              }
              internal_zip_reconstruct_bytes
                        (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,0x10ee38);
            }
            if (local_70 != 0) {
              if ((local_18->_rleBufferSize < local_78) ||
                 (local_18->_planarUncBufferSize[2] < local_70)) {
                return 0x17;
              }
              eVar3 = exr_uncompress_buffer
                                ((void *)CONCAT44(in_stack_fffffffffffffd4c,
                                                  in_stack_fffffffffffffd48),
                                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                 in_stack_fffffffffffffd38,
                                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                 (size_t *)in_stack_fffffffffffffd28);
              if (eVar3 != 0) {
                return 0x17;
              }
              if (local_180 != local_78) {
                return 0x17;
              }
              uVar7 = internal_rle_decompress
                                ((uint8_t *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                 (uint8_t *)in_stack_fffffffffffffd38,
                                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
              if (uVar7 != local_70) {
                return 0x17;
              }
            }
            for (local_188 = 0; local_188 < (ulong)(long)local_18->_numChannels;
                local_188 = local_188 + 1) {
              local_18->_channelData[local_188].processed = 0;
            }
            for (local_18c = local_18->_min[1]; local_18c <= local_18->_max[1];
                local_18c = local_18c + 1) {
              for (local_198 = 0; local_198 < (ulong)(long)local_18->_numChannels;
                  local_198 = local_198 + 1) {
                local_1a0 = local_18->_channelData + local_198;
                local_1a8 = local_1a0->chan;
                if ((local_18c % local_1a8->y_samples == 0) &&
                   (local_44 = DctCoderChannelData_push_row
                                         (in_stack_fffffffffffffd28,
                                          (uint8_t *)
                                          CONCAT44(in_stack_fffffffffffffd24,
                                                   in_stack_fffffffffffffd20)), local_44 != 0)) {
                  return local_44;
                }
              }
            }
            for (local_1b0 = 0; local_1b0 < (ulong)(long)local_18->_numCscChannelSets;
                local_1b0 = local_1b0 + 1) {
              pCVar8 = local_18->_cscChannelSets + local_1b0;
              iVar4 = pCVar8->idx[0];
              iVar5 = pCVar8->idx[1];
              iVar10 = pCVar8->idx[2];
              if (((local_18->_channelData[iVar4].compression != LOSSY_DCT) ||
                  (local_18->_channelData[iVar5].compression != LOSSY_DCT)) ||
                 (local_18->_channelData[iVar10].compression != LOSSY_DCT)) {
                return 0x17;
              }
              in_stack_fffffffffffffd18 = (local_18->_channelData[iVar4].chan)->width;
              in_stack_fffffffffffffd20 = (local_18->_channelData[iVar4].chan)->height;
              local_44 = LossyDctDecoderCsc_construct
                                   ((LossyDctDecoder *)in_stack_fffffffffffffd38,
                                    (DctCoderChannelData *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28,
                                    (DctCoderChannelData *)
                                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                    (uint8_t *)dwaCompressorToLinear,
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                    in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,
                                    in_stack_fffffffffffffd68);
              if (local_44 == 0) {
                local_44 = LossyDctDecoder_execute(d);
              }
              d = (LossyDctDecoder *)
                  ((long)d->_channel_decode_data + (long)local_200._packedDcCount * 2 + -0x30);
              local_18->_channelData[iVar4].processed = 1;
              local_18->_channelData[iVar5].processed = 1;
              local_18->_channelData[iVar10].processed = 1;
              LossyDctDecoder_destroy(&local_200);
              if (local_44 != 0) {
                return local_44;
              }
            }
            for (local_220 = 0; local_220 < (ulong)(long)local_18->_numChannels;
                local_220 = local_220 + 1) {
              pCVar12 = local_18->_channelData + local_220;
              peVar11 = pCVar12->chan;
              if (pCVar12->processed == 0) {
                iVar4 = (int)peVar11->bytes_per_element;
                CVar1 = pCVar12->compression;
                pCVar13 = pCVar12;
                if (CVar1 == UNKNOWN) {
                  iVar5 = 0;
                  iVar4 = peVar11->width * iVar4;
                  for (in_stack_fffffffffffffd44 = local_18->_min[1];
                      (int)in_stack_fffffffffffffd44 <= local_18->_max[1];
                      in_stack_fffffffffffffd44 =
                           in_stack_fffffffffffffd44 + EXR_TRANSCODE_BUFFER_UNPACKED) {
                    if ((int)in_stack_fffffffffffffd44 % peVar11->y_samples == 0) {
                      if (local_18->_planarUncBuffer[0] + local_18->_planarUncBufferSize[0] <
                          pCVar13->planarUncBufferEnd + iVar4) {
                        return 0x17;
                      }
                      memcpy((pCVar12->_dctData)._rows[iVar5],pCVar13->planarUncBufferEnd,
                             (long)iVar4);
                      pCVar13->planarUncBufferEnd = pCVar13->planarUncBufferEnd + iVar4;
                      iVar5 = iVar5 + 1;
                    }
                  }
                }
                else if (CVar1 == LOSSY_DCT) {
                  local_44 = LossyDctDecoder_construct
                                       ((LossyDctDecoder *)
                                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40
                                                ),in_stack_fffffffffffffd38,
                                        (uint8_t *)CONCAT44(1,in_stack_fffffffffffffd30),
                                        (uint8_t *)in_stack_fffffffffffffd28,
                                        (uint8_t *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),
                                        (uint16_t *)
                                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18
                                                ),in_stack_fffffffffffffd50,
                                        (int)in_stack_fffffffffffffd58);
                  pCVar13 = pCVar12;
                  if (local_44 == 0) {
                    local_44 = LossyDctDecoder_execute(d);
                    pCVar13 = pCVar12;
                  }
                  d = (LossyDctDecoder *)
                      ((long)d->_channel_decode_data + (long)local_294 * 2 + -0x30);
                  LossyDctDecoder_destroy((LossyDctDecoder *)&stack0xfffffffffffffd68);
                  if (local_44 != 0) {
                    return local_44;
                  }
                }
                else {
                  if (CVar1 != RLE) {
                    return 0x17;
                  }
                  local_29c = 0;
                  uVar9 = 2;
                  for (iVar5 = local_18->_min[1]; iVar5 <= local_18->_max[1]; iVar5 = iVar5 + 1) {
                    if (iVar5 % peVar11->y_samples == 0) {
                      in_stack_fffffffffffffd58 = (uint16_t *)(pCVar12->_dctData)._rows[local_29c];
                      if (iVar4 == 2) {
                        interleaveByte2((uint8_t *)in_stack_fffffffffffffd38,
                                        (uint8_t *)CONCAT44(uVar9,in_stack_fffffffffffffd30),
                                        (uint8_t *)in_stack_fffffffffffffd28,
                                        in_stack_fffffffffffffd24);
                        pCVar13->planarUncRleEnd[0] = pCVar13->planarUncRleEnd[0] + peVar11->width;
                        pCVar13->planarUncRleEnd[1] = pCVar13->planarUncRleEnd[1] + peVar11->width;
                      }
                      else {
                        for (iVar10 = 0; iVar10 < peVar11->width; iVar10 = iVar10 + 1) {
                          for (in_stack_fffffffffffffd50 = 0; in_stack_fffffffffffffd50 < iVar4;
                              in_stack_fffffffffffffd50 = in_stack_fffffffffffffd50 + 1) {
                            puVar2 = pCVar13->planarUncRleEnd[in_stack_fffffffffffffd50];
                            pCVar13->planarUncRleEnd[in_stack_fffffffffffffd50] = puVar2 + 1;
                            *(uint8_t *)in_stack_fffffffffffffd58 = *puVar2;
                            in_stack_fffffffffffffd58 =
                                 (uint16_t *)((long)in_stack_fffffffffffffd58 + 1);
                          }
                        }
                      }
                      local_29c = local_29c + 1;
                    }
                  }
                }
                pCVar13->processed = 1;
              }
            }
            local_c = local_44;
          }
          else {
            local_c = 0x16;
          }
        }
      }
      else {
        local_c = local_44;
      }
    }
  }
  return local_c;
}

Assistant:

exr_result_t
DwaCompressor_uncompress (
    DwaCompressor* me,
    const uint8_t* inPtr,
    uint64_t       iSize,
    void*          uncompressed_data,
    uint64_t       uncompressed_size)
{
    uint64_t     headerSize = NUM_SIZES_SINGLE * sizeof (uint64_t);
    exr_result_t rv         = EXR_ERR_SUCCESS;

    if (iSize < headerSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated header).");
    }

    //
    // Flip the counters from XDR to NATIVE
    //
    uint64_t counters[NUM_SIZES_SINGLE];

    memset (uncompressed_data, 0, uncompressed_size);

    memcpy (counters, inPtr, headerSize);
    priv_to_native64 (counters, NUM_SIZES_SINGLE);

    //
    // Unwind all the counter info
    //
    uint64_t version                 = counters[VERSION];
    uint64_t unknownUncompressedSize = counters[UNKNOWN_UNCOMPRESSED_SIZE];
    uint64_t unknownCompressedSize   = counters[UNKNOWN_COMPRESSED_SIZE];
    uint64_t acCompressedSize        = counters[AC_COMPRESSED_SIZE];
    uint64_t dcCompressedSize        = counters[DC_COMPRESSED_SIZE];
    uint64_t rleCompressedSize       = counters[RLE_COMPRESSED_SIZE];
    uint64_t rleUncompressedSize     = counters[RLE_UNCOMPRESSED_SIZE];
    uint64_t rleRawSize              = counters[RLE_RAW_SIZE];

    uint64_t totalAcUncompressedCount = counters[AC_UNCOMPRESSED_COUNT];
    uint64_t totalDcUncompressedCount = counters[DC_UNCOMPRESSED_COUNT];

    uint64_t acCompression = counters[AC_COMPRESSION];

    uint64_t compressedSize = unknownCompressedSize + acCompressedSize +
                              dcCompressedSize + rleCompressedSize;

    const uint8_t* dataPtr  = inPtr + headerSize;
    uint64_t       dataLeft = iSize - headerSize;

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize || iSize < acCompressedSize ||
        iSize < dcCompressedSize || iSize < rleCompressedSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated file).");
    }

    if ((int64_t) unknownUncompressedSize < 0 ||
        (int64_t) unknownCompressedSize < 0 || (int64_t) acCompressedSize < 0 ||
        (int64_t) dcCompressedSize < 0 || (int64_t) rleCompressedSize < 0 ||
        (int64_t) rleUncompressedSize < 0 || (int64_t) rleRawSize < 0 ||
        (int64_t) totalAcUncompressedCount < 0 ||
        (int64_t) totalDcUncompressedCount < 0)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               " (corrupt header).");
    }

    if (version < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        uint64_t ruleSize;
        rv =
            DwaCompressor_readChannelRules (me, &dataPtr, &dataLeft, &ruleSize);

        headerSize += ruleSize;
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    size_t outBufferSize = 0;
    rv                   = DwaCompressor_initializeBuffers (me, &outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    // the C++ classes used to have one buffer size for compress / uncompress
    // but here we want to do zero-ish copy...
    uint8_t* outBufferEnd = (uint8_t*) me->_decode->unpacked_buffer;
    //if (outBufferSize > me->_decode->unpacked_alloc_size)
    //{
    //    printf( "outbuffersize %lu larger than unpacked size %lu\n", outBufferSize, me->_decode->unpacked_alloc_size );
    //    return EXR_ERR_OUT_OF_MEMORY;
    //}
    outBufferSize = me->_decode->unpacked_alloc_size;

    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy
    // if you want to decode the channels in parallel later on.
    //

    uint8_t* packedAcBufferEnd = 0;

    if (me->_packedAcBuffer) packedAcBufferEnd = me->_packedAcBuffer;

    uint8_t* packedDcBufferEnd = 0;

    if (me->_packedDcBuffer) packedDcBufferEnd = me->_packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the
    // Huffman-compressed AC, then the DC values,
    // and then the zlib compressed RLE data.
    //

    const uint8_t* compressedUnknownBuf = dataPtr;

    const uint8_t* compressedAcBuf =
        compressedUnknownBuf + (ptrdiff_t) (unknownCompressedSize);
    const uint8_t* compressedDcBuf =
        compressedAcBuf + (ptrdiff_t) (acCompressedSize);
    const uint8_t* compressedRleBuf =
        compressedDcBuf + (ptrdiff_t) (dcCompressedSize);

    //
    // Sanity check that the version is something we expect. Right now,
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the
    // start of the data block.
    //

    if (version > 2)
    {
        return EXR_ERR_BAD_CHUNK_LEADER;
        //throw IEX_NAMESPACE::InputExc (
        //    "Invalid version of compressed data block");
    }

    rv = DwaCompressor_setupChannelData (me);

    //
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > me->_planarUncBufferSize[UNKNOWN])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedUnknownBuf,
                                   unknownCompressedSize,
                                   me->_planarUncBuffer[UNKNOWN],
                                   unknownUncompressedSize,
                                   NULL))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing UNKNOWN data.");
        }
    }

    //
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if (!me->_packedAcBuffer ||
            totalAcUncompressedCount * sizeof (uint16_t) >
                me->_packedAcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
            case STATIC_HUFFMAN:
                rv = internal_huf_decompress (
                    me->_decode,
                    compressedAcBuf,
                    acCompressedSize,
                    (uint16_t*) me->_packedAcBuffer,
                    totalAcUncompressedCount,
                    me->_decode->scratch_buffer_1,
                    me->_decode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS) { return rv; }
                break;

            case DEFLATE: {
                size_t destLen;

                rv = exr_uncompress_buffer (
                    compressedAcBuf,
                    acCompressedSize,
                    me->_packedAcBuffer,
                    totalAcUncompressedCount * sizeof (uint16_t),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (uint16_t) != destLen)
                {
                    return EXR_ERR_CORRUPT_CHUNK;
                    //throw IEX_NAMESPACE::InputExc ("AC data corrupt.");
                }
            }
            break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
                break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        size_t destLen;
        size_t uncompBytes = totalDcUncompressedCount * sizeof (uint16_t);
        if (uncompBytes > me->_packedDcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        rv = internal_decode_alloc_buffer (
            me->_decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_decode->scratch_buffer_1),
            &(me->_decode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_uncompress_buffer (
            compressedDcBuf,
            dcCompressedSize,
            me->_decode->scratch_buffer_1,
            uncompBytes,
            &destLen);
        if (rv != EXR_ERR_SUCCESS || (uncompBytes != destLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }

        internal_zip_reconstruct_bytes (
            me->_packedDcBuffer, (uint8_t*) me->_decode->scratch_buffer_1, uncompBytes);
    }
    else
    {
        // if the compressed size is 0, then the uncompressed size must also be zero
        if (totalDcUncompressedCount != 0)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > me->_rleBufferSize ||
            rleRawSize > me->_planarUncBufferSize[RLE])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        size_t dstLen;

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedRleBuf,
                                   rleCompressedSize,
                                   me->_rleBuffer,
                                   rleUncompressedSize,
                                   &dstLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }

        if (internal_rle_decompress (
                me->_planarUncBuffer[RLE],
                rleRawSize,
                (const uint8_t*) me->_rleBuffer,
                rleUncompressedSize) != rleRawSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), outBufferEnd);
            if (rv != EXR_ERR_SUCCESS) return rv;

            outBufferEnd += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctDecoder decoder;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        int rChan = cset->idx[0];
        int gChan = cset->idx[1];
        int bChan = cset->idx[2];

        if (me->_channelData[rChan].compression != LOSSY_DCT ||
            me->_channelData[gChan].compression != LOSSY_DCT ||
            me->_channelData[bChan].compression != LOSSY_DCT)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Bad DWA compression type detected");
        }

        rv = LossyDctDecoderCsc_construct (
            &decoder,
            &(me->_channelData[rChan]._dctData),
            &(me->_channelData[gChan]._dctData),
            &(me->_channelData[bChan]._dctData),
            packedAcBufferEnd,
            packedAcBufferEnd + totalAcUncompressedCount * sizeof (uint16_t),
            packedDcBufferEnd,
            dwaCompressorToLinear,
            me->_channelData[rChan].chan->width,
            me->_channelData[rChan].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctDecoder_execute (&decoder);

        packedAcBufferEnd += decoder._packedAcCount * sizeof (uint16_t);

        packedDcBufferEnd += decoder._packedDcCount * sizeof (uint16_t);

        me->_channelData[rChan].processed = 1;
        me->_channelData[gChan].processed = 1;
        me->_channelData[bChan].processed = 1;

        LossyDctDecoder_destroy (&decoder);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*               cd      = &(me->_channelData[c]);
        exr_coding_channel_info_t* chan    = cd->chan;
        DctCoderChannelData*       dcddata = &(cd->_dctData);

        if (cd->processed) continue;

        int pixelSize = chan->bytes_per_element;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // Setup a single-channel lossy DCT decoder pointing
                // at the output buffer
                //

                {
                    const uint16_t* linearLut = NULL;
                    LossyDctDecoder decoder;

                    if (!chan->p_linear) linearLut = dwaCompressorToLinear;

                    rv = LossyDctDecoder_construct (
                        &decoder,
                        dcddata,
                        packedAcBufferEnd,
                        packedAcBufferEnd +
                            totalAcUncompressedCount * sizeof (uint16_t),
                        packedDcBufferEnd,
                        linearLut,
                        chan->width,
                        chan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctDecoder_execute (&decoder);

                    packedAcBufferEnd +=
                        decoder._packedAcCount * sizeof (uint16_t);

                    packedDcBufferEnd +=
                        decoder._packedDcCount * sizeof (uint16_t);

                    LossyDctDecoder_destroy (&decoder);
                    if (rv != EXR_ERR_SUCCESS) { return rv; }
                }

                break;

            case RLE:

                //
                // For the RLE case, the data has been un-RLE'd into
                // planarUncRleEnd[], but is still split out by bytes.
                // We need to rearrange the bytes back into the correct
                // order in the output buffer;
                //

                {
                    int row = 0;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        uint8_t* dst = dcddata->_rows[row];

                        if (pixelSize == 2)
                        {
                            interleaveByte2 (
                                dst,
                                cd->planarUncRleEnd[0],
                                cd->planarUncRleEnd[1],
                                chan->width);

                            cd->planarUncRleEnd[0] += chan->width;
                            cd->planarUncRleEnd[1] += chan->width;
                        }
                        else
                        {
                            for (int x = 0; x < chan->width; ++x)
                            {
                                for (int byte = 0; byte < pixelSize; ++byte)
                                {
                                    *dst++ = *cd->planarUncRleEnd[byte]++;
                                }
                            }
                        }

                        row++;
                    }
                }

                break;

            case UNKNOWN:

                //
                // In the UNKNOWN case, data is already in planarUncBufferEnd
                // and just needs to copied over to the output buffer
                //

                {
                    int row             = 0;
                    int dstScanlineSize = chan->width * pixelSize;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        //
                        // sanity check for buffer data lying within range
                        //
                        if ((cd->planarUncBufferEnd +
                             (size_t) (dstScanlineSize)) >
                            (me->_planarUncBuffer[UNKNOWN] +
                             me->_planarUncBufferSize[UNKNOWN]))
                        {
                            return EXR_ERR_CORRUPT_CHUNK;
                            //throw IEX_NAMESPACE::InputExc ("DWA data corrupt");
                        }

                        memcpy (
                            dcddata->_rows[row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                        cd->planarUncBufferEnd += dstScanlineSize;
                        row++;
                    }
                }

                break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc (
                //    "Unhandled compression scheme case");
                break;
        }

        cd->processed = 1;
    }

    return rv;
}